

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::solve
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority,int prec_cur,int prec_opo,bool *reached_bottom_cur,
          bool *reached_bottom_opo)

{
  int iVar1;
  bool bVar2;
  vector<int,_std::allocator<int>_> local_98;
  undefined1 local_79;
  vector<int,_std::allocator<int>_> local_78;
  bool local_5e;
  bool local_5d [7];
  bool atr_greater;
  bool reached_bottom_opo_last;
  int local_4c;
  undefined1 local_48 [4];
  int num_nodes_in_h;
  vector<int,_std::allocator<int>_> saved_nodes;
  bool *reached_bottom_cur_local;
  int prec_opo_local;
  int prec_cur_local;
  int max_priority_local;
  ZLKPPSolver *this_local;
  vector<int,_std::allocator<int>_> *winning_region;
  
  saved_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)reached_bottom_cur;
  if (this->cur_num_nodes == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  }
  else {
    get_cur_nodes((vector<int,_std::allocator<int>_> *)local_48,this);
    iVar1 = this->variant;
    if (iVar1 == 0) {
      do {
        bVar2 = do_step(this,max_priority,prec_cur,prec_opo,&local_4c,
                        (bool *)saved_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,reached_bottom_opo);
      } while (bVar2);
    }
    else if (iVar1 == 1) {
      local_5e = true;
      while (local_5e != false) {
        local_5d[0] = false;
        local_5e = do_step(this,max_priority,prec_cur,prec_opo / 2,&local_4c,
                           (bool *)saved_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,local_5d);
        *reached_bottom_opo = (*reached_bottom_opo & 1U) != 0 || (local_5d[0] & 1U) != 0;
      }
      if (((prec_opo / 2 < local_4c) && ((local_5d[0] & 1U) != 0)) &&
         (bVar2 = do_step(this,max_priority,prec_cur,prec_opo,&local_4c,
                          (bool *)saved_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,reached_bottom_opo),
         bVar2)) {
        do {
          bVar2 = do_step(this,max_priority,prec_cur,prec_opo / 2,&local_4c,
                          (bool *)saved_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,reached_bottom_opo);
        } while (bVar2);
      }
    }
    else if (iVar1 == 2) {
      solve_liverpool(this,max_priority,prec_cur,prec_opo,
                      (bool *)saved_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,reached_bottom_opo);
    }
    get_nodes_of_max_priority(&local_78,this,max_priority);
    std::vector<int,_std::allocator<int>_>::~vector(&local_78);
    local_79 = 0;
    get_cur_nodes(__return_storage_ptr__,this);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_98,(vector<int,_std::allocator<int>_> *)local_48);
    set_cur_nodes(this,&local_98);
    std::vector<int,_std::allocator<int>_>::~vector(&local_98);
    local_79 = 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::solve(int max_priority, int prec_cur, int prec_opo, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    if (!cur_num_nodes)
        return std::vector<int>();
    auto saved_nodes = get_cur_nodes();
    int num_nodes_in_h;
    switch (variant) {

    case ZLK_STANDARD:
        while (do_step(max_priority, prec_cur, prec_opo, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo));
        break;

    case ZLK_WARSAW:
        bool reached_bottom_opo_last, atr_greater;
        atr_greater = true;
        while (atr_greater) {
            reached_bottom_opo_last = false;
            atr_greater = do_step(max_priority, prec_cur, prec_opo / 2, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo_last);
            reached_bottom_opo |= reached_bottom_opo_last;
        }
        if (num_nodes_in_h <= prec_opo / 2 || !reached_bottom_opo_last)
            break;
        if (do_step(max_priority, prec_cur, prec_opo, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo))
            while (do_step(max_priority, prec_cur, prec_opo / 2, num_nodes_in_h, reached_bottom_cur, reached_bottom_opo));
        break;
    
    case ZLK_LIVERPOOL:
        solve_liverpool(max_priority, prec_cur, prec_opo, reached_bottom_cur, reached_bottom_opo);
        break;
    }
    
    // we should set strategy in nodes of maximal priority to an arbitrary node that remains in the subgame now:
    get_nodes_of_max_priority(max_priority);

    auto winning_region = get_cur_nodes();
    set_cur_nodes(saved_nodes); // the current game remains unchanged at the end
    return winning_region;
}